

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O3

vector<std::reference_wrapper<duckdb::Binding>,_true> * __thiscall
duckdb::BindContext::GetMatchingBindings
          (vector<std::reference_wrapper<duckdb::Binding>,_true> *__return_storage_ptr__,
          BindContext *this,string *column_name)

{
  pointer *pprVar1;
  unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *puVar2;
  iterator __position;
  type in_RAX;
  type pBVar3;
  iterator iVar4;
  unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *binding_ptr;
  unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *this_00;
  reference_wrapper<duckdb::Binding> local_38;
  
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar2 = (this->bindings_list).
           super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38._M_data = in_RAX;
  for (this_00 = (this->bindings_list).
                 super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != puVar2; this_00 = this_00 + 1
      ) {
    pBVar3 = unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>::operator*
                       (this_00);
    iVar4 = ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(pBVar3->name_map)._M_h,column_name);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
        ._M_cur != (__node_type *)0x0) {
      __position._M_current =
           (__return_storage_ptr__->
           super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
           ).
           super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_38._M_data = pBVar3;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
          ).
          super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::
        vector<std::reference_wrapper<duckdb::Binding>,std::allocator<std::reference_wrapper<duckdb::Binding>>>
        ::_M_realloc_insert<std::reference_wrapper<duckdb::Binding>>
                  ((vector<std::reference_wrapper<duckdb::Binding>,std::allocator<std::reference_wrapper<duckdb::Binding>>>
                    *)__return_storage_ptr__,__position,&local_38);
      }
      else {
        (__position._M_current)->_M_data = pBVar3;
        pprVar1 = &(__return_storage_ptr__->
                   super_vector<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
                   ).
                   super__Vector_base<std::reference_wrapper<duckdb::Binding>,_std::allocator<std::reference_wrapper<duckdb::Binding>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pprVar1 = *pprVar1 + 1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<reference<Binding>> BindContext::GetMatchingBindings(const string &column_name) {
	vector<reference<Binding>> result;
	for (auto &binding_ptr : bindings_list) {
		auto &binding = *binding_ptr;
		if (binding.HasMatchingBinding(column_name)) {
			result.push_back(binding);
		}
	}
	return result;
}